

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::_Pool::
Allocate(_Pool *this,pair<unsigned_long,_short> *value)

{
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *this_00;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *result
  ;
  
  this_00 = this->cache;
  if (this_00 ==
      (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *)
      0x0) {
    this_00 = (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
               *)operator_new(0x40);
    Node(this_00,value,this);
  }
  else {
    this->cache = (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                   *)0x0;
    Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::
    Initialize(this_00,value);
  }
  return this_00;
}

Assistant:

Node *Allocate(const T &value) {
			if (cache) {
				Node *result = cache;
				cache = nullptr;
				result->Initialize(value);
				return result;
			}

			return new Node(value, _compare, *this);
		}